

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxAnalysis.h
# Opt level: O3

shared_ptr<const_calc4::Operator> __thiscall
calc4::LoadVariableToken::CreateOperator
          (LoadVariableToken *this,
          vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          *operands,CompilationContext *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_calc4::Operator> sVar1;
  undefined1 local_29;
  _func_int **local_28;
  size_t sStack_20;
  
  std::
  __shared_ptr<calc4::LoadVariableOperator::AllocateHelper<calc4::LoadVariableOperator>::Object,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<calc4::LoadVariableOperator::AllocateHelper<calc4::LoadVariableOperator>::Object>,std::__cxx11::string_const&>
            ((__shared_ptr<calc4::LoadVariableOperator::AllocateHelper<calc4::LoadVariableOperator>::Object,(__gnu_cxx::_Lock_policy)2>
              *)&local_28,
             (allocator<calc4::LoadVariableOperator::AllocateHelper<calc4::LoadVariableOperator>::Object>
              *)&local_29,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(operands + 1));
  (this->super_Token)._vptr_Token = local_28;
  (this->super_Token).position.index = sStack_20;
  sVar1.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_calc4::Operator>)
         sVar1.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const Operator> CreateOperator(
        const std::vector<std::shared_ptr<const Operator>>& operands,
        CompilationContext& context) const override
    {
        return LoadVariableOperator::Create(supplementaryText);
    }